

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3img.cpp
# Opt level: O0

void __thiscall
CTcGenTarg::write_nontads_objs_to_image
          (CTcGenTarg *this,CTcDataStream *os,CVmImageWriter *image_writer,int meta_idx,
          int large_objs)

{
  uint uVar1;
  int iVar2;
  CVmImageWriter *pCVar3;
  CVmImageWriter *pCVar4;
  CTcDataStream *in_RSI;
  int in_R8D;
  ulong avail_len;
  char *p;
  ulong next_ofs;
  ulong rem_len;
  uint block_size;
  uint cnt;
  uint siz;
  ulong ofs;
  ulong start_ofs;
  char *in_stack_ffffffffffffff88;
  CVmImageWriter *available_len;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  char *in_stack_ffffffffffffffa8;
  CVmImageWriter *in_stack_ffffffffffffffb0;
  ulong local_48;
  int local_38;
  uint local_34;
  CVmImageWriter *local_30;
  CVmImageWriter *local_28;
  
  local_28 = (CVmImageWriter *)0x0;
  do {
    available_len = local_28;
    pCVar3 = (CVmImageWriter *)CTcDataStream::get_ofs(in_RSI);
    if (pCVar3 <= available_len) {
      return;
    }
    local_30 = local_28;
    local_38 = 0;
    while (pCVar3 = local_30, pCVar4 = (CVmImageWriter *)CTcDataStream::get_ofs(in_RSI),
          pCVar3 < pCVar4) {
      if (in_R8D == 0) {
        iVar2 = CTcDataStream::read2_at
                          ((CTcDataStream *)
                           CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                           (ulong)available_len);
        local_34 = iVar2 + 6;
        if ((local_38 != 0) && (64000 < local_34)) break;
      }
      else {
        uVar1 = CTcDataStream::readu4_at
                          ((CTcDataStream *)
                           CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                           (ulong)available_len);
        local_34 = uVar1 + 8;
      }
      if (local_38 == 0) {
        CVmImageWriter::begin_objs_block
                  (in_stack_ffffffffffffffb0,(uint)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                   (int)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4);
      }
      in_stack_ffffffffffffffb0 = (CVmImageWriter *)((long)&local_30->fp_ + (ulong)local_34);
      for (local_48 = (ulong)local_34; local_48 != 0;
          local_48 = local_48 - CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)) {
        in_stack_ffffffffffffffa8 =
             CTcDataStream::get_block_ptr
                       ((CTcDataStream *)in_stack_ffffffffffffffb0,(ulong)in_stack_ffffffffffffffa8,
                        CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                        (ulong *)available_len);
        CVmImageWriter::write_objs_bytes(pCVar3,in_stack_ffffffffffffff88,0);
      }
      local_38 = local_38 + 1;
      local_30 = in_stack_ffffffffffffffb0;
    }
    if (local_38 != 0) {
      CVmImageWriter::end_objs_block
                ((CVmImageWriter *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 (uint)((ulong)available_len >> 0x20));
    }
    local_28 = local_30;
  } while( true );
}

Assistant:

void CTcGenTarg::write_nontads_objs_to_image(CTcDataStream *os,
                                             CVmImageWriter *image_writer,
                                             int meta_idx, int large_objs)
{
    /* keep going until we've written the whole file */
    for (ulong start_ofs = 0 ; start_ofs < os->get_ofs() ; )
    {
        ulong ofs;
        uint siz;
        uint cnt;
        uint block_size;

        /* 
         *   Scan the stream.  Each entry in the stream is either a small or
         *   large object record, which means that it starts with the object
         *   ID (UINT4) and the length (UINT2 for small, UINT4 for large) of
         *   the metaclass-specific data, which is then followed by the
         *   metaclass data.
         *   
         *   Include as many objects as we can while staying within our
         *   approximately 64k limit, if this is a small-format block; fill
         *   the block without limit if this is a large-format block.  
         */
        for (block_size = 0, ofs = start_ofs, cnt = 0 ; ; )
        {
            ulong rem_len;
            ulong next_ofs;

            /* if we've reached the end of the stream, we're done */
            if (ofs >= os->get_ofs())
                break;

            /* 
             *   get the size of this block - this is the
             *   metaclass-specific data size at offset 4 in the T3
             *   metaclass header, plus the size of the T3 metaclass
             *   header 
             */
            if (large_objs)
            {
                /* 
                 *   Get the 32-bit size value.  Note that we don't worry
                 *   about limiting the overall block size to 64k when we're
                 *   writing a "large" object block.  
                 */
                siz = (ulong)os->readu4_at(ofs + 4)
                      + TCT3_LARGE_META_HEADER_SIZE;
            }
            else
            {
                /* get the 16-bit size value */
                siz = (ulong)os->read2_at(ofs + 4)
                      + TCT3_META_HEADER_SIZE;

                /* 
                 *   Since this is a small-object block, limit the aggregate
                 *   size of the entire block to 64k.  So, if this block
                 *   would push us over the 64k aggregate for the block,
                 *   start a new OBJS block with this object.  
                 */
                if (cnt != 0 && block_size + siz > 64000L)
                    break;
            }

            /* 
             *   if this is the first object in this block, write the
             *   block header - the dictionary uses large object headers,
             *   so note that 
             */
            if (cnt == 0)
                image_writer->begin_objs_block(meta_idx, large_objs, FALSE);

            /* calculate the offset of the next block */
            next_ofs = ofs + siz;

            /* write the object data */
            for (rem_len = siz ; rem_len != 0 ; )
            {
                const char *p;
                ulong avail_len;

                /* get the next block */
                p = os->get_block_ptr(ofs, rem_len, &avail_len);

                /* write it out */
                image_writer->write_objs_bytes(p, avail_len);
                
                /* move past this block */
                ofs += avail_len;
                rem_len -= avail_len;
            }
                
            /* count the object */
            ++cnt;

            /* move on to the next block */
            ofs = next_ofs;
        }

        /* if we wrote any objects, end the block */
        if (cnt != 0)
            image_writer->end_objs_block(cnt);

        /* move on to the next block */
        start_ofs = ofs;
    }
}